

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsPreInt
          (ChElementBeamANCF_3333 *this)

{
  ChVectorN<double,_6> *src;
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  Matrix<double,__1,__1,_0,__1,__1> *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  scalar_constant_op<double> sVar5;
  undefined1 auVar6 [8];
  CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *pCVar7;
  Scalar *pSVar8;
  long lVar9;
  double dVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  long lVar14;
  long lVar15;
  uint t;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  ChMatrixNM<double,_6,_6> D;
  double GQWeight_det_J_0xi;
  ChMatrixNM<double,_3,_3> D22;
  ChMatrixNM<double,_3,_3> D11;
  ChMatrixNM<double,_3,_3> D33;
  double GQWeight_det_J_0xi_1;
  MatrixNx3c Sxi_D_1;
  ChMatrix33<double> J_0xi;
  MatrixNx3c Sxi_D_0xi;
  ChMatrix33<double> J_0xi_1;
  MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
  MatrixNxN scale;
  MatrixNx3c Sxi_D;
  ChMatrixNM<double,_9,_9> D_block;
  undefined1 local_ee0 [8];
  PointerType local_ed8;
  double local_ed0;
  Scalar local_ec8;
  Scalar local_ec0;
  Scalar local_eb8;
  double local_eb0;
  double local_ea8;
  double local_ea0;
  Scalar local_e98;
  Scalar local_e90;
  Scalar local_e88;
  double local_e80;
  double local_e78;
  double local_e70;
  Scalar local_e68;
  Scalar local_e60;
  Scalar local_e58;
  double local_e50;
  XprTypeNested local_e48;
  XprTypeNested local_e40;
  Scalar local_e38;
  Scalar local_e30;
  Scalar local_e28;
  XprTypeNested local_e20;
  double local_e18;
  double local_e10;
  Scalar local_e08;
  Scalar local_e00;
  Scalar local_df8;
  double local_df0;
  PointerType local_de8;
  PointerType local_de0;
  Scalar local_dd8;
  Scalar local_dd0;
  Scalar local_dc8;
  element_type *local_dc0;
  ChElementBeamANCF_3333 *local_db8;
  double local_db0;
  double local_da8;
  double local_da0;
  Matrix<double,__1,__1,_0,__1,__1> *local_d98;
  Matrix3xN *local_d90;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_d88;
  __shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *local_d80;
  Matrix<double,__1,__1,_0,__1,__1> *local_d78;
  double *local_d70;
  ChVectorN<double,_6> *local_d68;
  double local_d60;
  double local_d58;
  double local_d50;
  double local_d48;
  undefined1 local_d40 [16];
  scalar_constant_op<double> sStack_d30;
  variable_if_dynamic<long,__1> vStack_d28;
  variable_if_dynamic<long,__1> vStack_d20;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *pPStack_d18;
  variable_if_dynamic<long,__1> vStack_d10;
  variable_if_dynamic<long,__1> local_d08;
  PointerType local_d00;
  undefined1 local_cf0 [16];
  scalar_constant_op<double> sStack_ce0;
  variable_if_dynamic<long,__1> vStack_cd8;
  variable_if_dynamic<long,__1> vStack_cd0;
  element_type *peStack_cc8;
  XprTypeNested pMStack_cc0;
  double dStack_cb8;
  double dStack_cb0;
  undefined1 *local_ca0;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *local_c90;
  double local_c88;
  double local_c80;
  double local_c78;
  undefined1 local_c70 [16];
  scalar_constant_op<double> local_c60;
  PointerType local_c58;
  double dStack_c50;
  XprTypeNested pMStack_c48;
  variable_if_dynamic<long,__1> vStack_c40;
  variable_if_dynamic<long,__1> local_c38;
  double local_c30;
  undefined1 local_c20 [16];
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *pPStack_c10;
  variable_if_dynamic<long,__1> vStack_c08;
  variable_if_dynamic<long,__1> vStack_c00;
  PointerType pdStack_bf8;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *local_bf0 [2];
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *local_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined1 *local_bc0 [2];
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *local_bb0;
  undefined8 local_ba8;
  undefined8 local_ba0;
  undefined8 local_b98;
  double *local_b90 [2];
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *local_b80;
  undefined8 local_b78;
  undefined8 local_b70;
  undefined8 local_b68;
  undefined1 local_b60 [16];
  element_type *peStack_b50;
  variable_if_dynamic<long,__1> vStack_b48;
  variable_if_dynamic<long,__1> local_b40;
  element_type *peStack_b38;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *pPStack_b30;
  double dStack_b28;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *pPStack_b20;
  PointerType pdStack_b18;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *pPStack_b10;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *pPStack_b08;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *local_af8;
  undefined1 local_af0 [16];
  double local_ae0;
  double local_ac8;
  PointerType pdStack_ac0;
  double dStack_ab8;
  XprTypeNested local_ab0;
  double dStack_aa8;
  double dStack_aa0;
  double dStack_a98;
  double *local_a88;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *local_a78;
  double local_a70;
  double local_a68;
  double local_a60;
  undefined1 local_a48 [16];
  scalar_constant_op<double> sStack_a38;
  variable_if_dynamic<long,__1> vStack_a30;
  variable_if_dynamic<long,__1> vStack_a28;
  element_type *peStack_a20;
  undefined1 local_a00 [16];
  element_type *peStack_9f0;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *pPStack_9e8;
  PointerType pdStack_9e0;
  element_type *peStack_9d8;
  PointerType local_9d0;
  element_type *peStack_9c8;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *pPStack_9c0;
  double dStack_9b8;
  PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *pPStack_9b0;
  PointerType pdStack_9a8;
  undefined1 local_970 [88];
  undefined1 local_918 [80];
  undefined1 local_8c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_8c0;
  XprTypeNested pMStack_8b8;
  variable_if_dynamic<long,__1> vStack_8b0;
  scalar_constant_op<double> sStack_8a8;
  variable_if_dynamic<long,__1> vStack_8a0;
  element_type *peStack_898;
  RhsNested local_890;
  variable_if_dynamic<long,__1> local_888;
  variable_if_dynamic<long,__1> local_880;
  element_type *local_878;
  undefined1 local_640 [8];
  variable_if_dynamic<long,__1> vStack_638;
  scalar_constant_op<double> sStack_630;
  variable_if_dynamic<long,__1> vStack_628;
  variable_if_dynamic<long,__1> vStack_620;
  variable_if_dynamic<long,__1> vStack_618;
  undefined1 local_3b8 [216];
  Matrix<double,_9,_9,_1,_9,_9> local_2e0;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  this_00 = &this->m_O1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0x51,0x51);
  local_d78 = &this->m_O2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_d78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0x51,0x51)
  ;
  this_01 = &this->m_K3Compact;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,9,9);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&(this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             9,9);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->m_K13Compact);
  local_d88 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_01;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_01);
  local_d98 = this_00;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00);
  local_d80 = &(this->m_material).
               super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>;
  local_db8 = this;
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)&local_2e0
             ,local_d80);
  local_dc0 = (element_type *)
              local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.
              m_data.array[0];
  src = (ChVectorN<double,_6> *)
        ((long)local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.
               m_data.array[0] + 0x10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.
              m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)local_ee0);
  local_d68 = src;
  local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[0] =
       (double)local_ee0;
  Eigen::internal::
  call_assignment<Eigen::Diagonal<Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,1,0,6,1>>
            ((Diagonal<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0> *)&local_2e0,src);
  vStack_638.m_value = 0;
  sStack_630.m_other = 4.94065645841247e-324;
  vStack_628.m_value = 1;
  local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[0] =
       (double)local_ee0;
  local_640 = (undefined1  [8])&local_2e0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_640,
                      &local_eb8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ec0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_eb8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_ed8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ec8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ec0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ec8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ed0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dc8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dc8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_de8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_de0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e20);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e00);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e18);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e08);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e00);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e08);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e10);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dc8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dc8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_de8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_de0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_eb0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e88);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e90);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e88);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ea8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e98);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e90);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e98);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ea0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e50);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e28);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e30);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e28);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e48);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e38);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e30);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e38);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e40);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e20);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e00);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e18);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e08);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e00);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e08);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e10);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e50);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e28);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e30);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e28);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e48);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e38);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e30);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e38);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e40);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e80);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e58);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e60);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e58);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e78);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e68);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e60);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e68);
  Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar7,&local_e70);
  Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_640);
  local_d90 = &local_db8->m_ebar0;
  local_d70 = (local_dc0->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
              m_storage.m_data.array + 1;
  local_dc0 = (element_type *)
              ((local_dc0->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
               m_storage.m_data.array + 2);
  uVar11 = 0;
  lVar15 = DAT_011df5d0;
  while (dVar10 = (double)(ulong)uVar11,
        (ulong)dVar10 < (ulong)(*(long *)(lVar15 + 0x38) - *(long *)(lVar15 + 0x30) >> 3)) {
    lVar9 = *(long *)(lVar15 + 0x18);
    lVar14 = *(long *)(lVar15 + 0x20);
    uVar11 = 0;
    local_d60 = dVar10;
    while ((ulong)uVar11 < (ulong)(lVar14 - lVar9 >> 3)) {
      uVar12 = 0;
      local_d58 = (double)(ulong)uVar11;
      while( true ) {
        lVar14 = *(long *)(lVar15 + 0x20);
        lVar9 = *(long *)(lVar15 + 0x18);
        dVar13 = (double)(ulong)uVar12;
        if ((ulong)(lVar14 - lVar9 >> 3) <= (ulong)dVar13) break;
        dVar1 = *(double *)(*(long *)(static_tables_3333 + 0x30) + (long)dVar10 * 8);
        dVar2 = *(double *)(*(long *)(static_tables_3333 + 0x18) + (long)local_d58 * 8);
        dVar3 = *(double *)(*(long *)(static_tables_3333 + 0x18) + (long)dVar13 * 8);
        local_db0 = dVar13;
        Calc_Sxi_D(local_db8,(MatrixNx3c *)local_3b8,
                   *(double *)(*(long *)(lVar15 + 0x30) + (long)dVar10 * 8),
                   *(double *)(lVar9 + (long)local_d58 * 8),*(double *)(lVar9 + (long)dVar13 * 8));
        local_640 = (undefined1  [8])local_d90;
        local_8c8 = (undefined1  [8])local_a48;
        vStack_638.m_value = (long)local_3b8;
        Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_8c8,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_3,_0,_9,_3>,_0>_>
                    *)local_640);
        local_640 = (undefined1  [8])local_3b8;
        vStack_638.m_value = (long)local_a48;
        Eigen::PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>>::
        _set_noalias<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_a00,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
                    *)local_640);
        auVar18._0_8_ =
             Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                       ((Matrix<double,_3,_3,_1,_3,_3> *)local_a48);
        auVar18._8_56_ = extraout_var;
        auVar4._8_8_ = 0x8000000000000000;
        auVar4._0_8_ = 0x8000000000000000;
        auVar17 = vxorpd_avx512vl(auVar18._0_16_,auVar4);
        local_d48 = auVar17._0_8_ * dVar1 * dVar2 * dVar3;
        local_d50 = local_d48 * 0.5;
        local_bd8 = 0;
        uStack_bd0 = 0;
        local_bc8 = 9;
        local_bf0[0] = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_a00;
        local_be0 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_a00;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>
                          *)local_d40,(double *)local_d68,(StorageBaseType *)local_bf0);
        sVar5.m_other = sStack_d30.m_other;
        local_b78 = 0;
        local_c20._0_8_ = vStack_d28.m_value;
        local_c20._8_8_ = vStack_d20.m_value;
        pPStack_c10 = pPStack_d18;
        vStack_c08.m_value = vStack_d10.m_value;
        vStack_c00.m_value = local_d08.m_value;
        pdStack_bf8 = local_d00;
        local_b70 = 1;
        local_b68 = 9;
        local_b90[0] = &dStack_9b8;
        local_b80 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_a00;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>
                          *)local_c70,local_d70,(StorageBaseType *)local_b90);
        dStack_aa0 = (double)local_c38.m_value;
        dStack_a98 = local_c30;
        pdStack_ac0 = local_c58;
        dStack_ab8 = dStack_c50;
        local_ab0 = pMStack_c48;
        dStack_aa8 = (double)vStack_c40.m_value;
        vStack_b48.m_value = (long)sVar5.m_other;
        pPStack_b20 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)vStack_c00.m_value;
        pdStack_b18 = pdStack_bf8;
        local_b40.m_value = local_c20._0_8_;
        peStack_b38 = (element_type *)local_c20._8_8_;
        pPStack_b30 = pPStack_c10;
        dStack_b28 = (double)vStack_c08.m_value;
        local_af0 = ZEXT816(0) << 0x20;
        local_ae0 = 4.44659081257122e-323;
        local_ac8 = local_c60.m_other;
        local_a70 = 0.0;
        local_a68 = 4.94065645841247e-324;
        local_a60 = 4.44659081257122e-323;
        local_ba8 = 0;
        local_ba0 = 2;
        local_b98 = 9;
        local_bc0[0] = local_970;
        local_bb0 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_a00;
        pPStack_b08 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_a00;
        local_af8 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_a00;
        local_a88 = &dStack_9b8;
        local_a78 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_a00;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>
                          *)local_918,&local_dc0->m_rho,(StorageBaseType *)local_bc0);
        sStack_ce0.m_other = (double)local_918._16_8_;
        dStack_cb8 = (double)local_918._56_8_;
        dStack_cb0 = (double)local_918._64_8_;
        vStack_cd8.m_value = local_918._24_8_;
        vStack_cd0.m_value = local_918._32_8_;
        peStack_cc8 = (element_type *)local_918._40_8_;
        pMStack_cc0 = (XprTypeNested)local_918._48_8_;
        local_c88 = 0.0;
        local_c80 = 9.88131291682493e-324;
        local_c78 = 4.44659081257122e-323;
        local_ca0 = local_970;
        local_c90 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_a00;
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>>,0>const>>
        ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>_>
                     *)local_8c8,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>>,0>const>>
                     *)local_b60,
                    (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>_>
                     *)local_cf0);
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>_>_>
                          *)local_640,&local_d50,(StorageBaseType *)local_8c8);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
                  (local_d88,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>_>_>_>
                    *)local_640);
        for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
          local_da8 = (double)(lVar15 * 3);
          dVar10 = 0.0;
          while (dVar10 != 1.48219693752374e-323) {
            Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>::Block
                      ((Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false> *)local_b60,
                       &local_2e0,(Index)local_da8,(long)dVar10 * 3);
            vStack_8a0.m_value = local_b40.m_value;
            peStack_898 = peStack_b38;
            _Stack_8c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b60._0_8_;
            pMStack_8b8 = (XprTypeNested)local_b60._8_8_;
            vStack_8b0.m_value = (long)peStack_b50;
            sStack_8a8.m_other = (double)vStack_b48.m_value;
            local_8c8 = (undefined1  [8])local_a00;
            local_890.m_matrix = (non_const_type)local_a00;
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,9,9,1,9,9>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,3,3,false>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,0>>
                      ((Matrix<double,_9,_9,_1,_9,_9> *)local_640,
                       (Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>
                        *)local_8c8);
            Eigen::DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator*=
                      ((DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_640,&local_d48);
            Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>::Block
                      ((Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false> *)local_cf0,
                       (Matrix<double,_9,_3,_0,_9,_3> *)local_a00,0,lVar15);
            local_da0 = dVar10;
            Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>::Block
                      ((Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false> *)local_d40,
                       (Matrix<double,_9,_3,_0,_9,_3> *)local_a00,0,(Index)dVar10);
            pPStack_b10 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)vStack_d20.m_value;
            pPStack_b08 = pPStack_d18;
            pPStack_b30 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_d40._0_8_;
            dStack_b28 = (double)local_d40._8_8_;
            pPStack_b20 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)sStack_d30.m_other;
            pdStack_b18 = (PointerType)vStack_d28.m_value;
            local_b60._0_8_ = local_cf0._0_8_;
            local_b60._8_8_ = local_cf0._8_8_;
            peStack_b50 = (element_type *)sStack_ce0.m_other;
            vStack_b48.m_value = vStack_cd8.m_value;
            local_b40.m_value = vStack_cd0.m_value;
            peStack_b38 = peStack_cc8;
            Eigen::PlainObjectBase<Eigen::Matrix<double,9,9,1,9,9>>::
            _set_noalias<Eigen::Product<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>>,0>>
                      ((PlainObjectBase<Eigen::Matrix<double,9,9,1,9,9>> *)local_8c8,
                       (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>_>
                        *)local_b60);
            for (lVar9 = 0; lVar9 != 9; lVar9 = lVar9 + 1) {
              lVar14 = 0;
              for (lVar16 = 0; lVar16 != 9; lVar16 = lVar16 + 1) {
                pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_1> *)
                                    local_640,lVar16,lVar9);
                Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>
                                  *)local_cf0,pSVar8,(StorageBaseType *)local_8c8);
                Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_9,_9,_false>::Block
                          ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_9,_9,_false> *)local_b60
                           ,local_d98,lVar14,lVar9 * 9);
                Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,9,9,false>>::
                operator+=((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,9,9,false>>
                            *)local_b60,
                           (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>
                            *)local_cf0);
                lVar14 = lVar14 + 9;
              }
            }
            dVar10 = (double)((long)local_da0 + 1);
          }
        }
        uVar12 = SUB84(local_db0,0) + 1;
        lVar15 = DAT_011df5d0;
        dVar10 = local_d60;
      }
      uVar11 = SUB84(local_d58,0) + 1;
    }
    uVar11 = SUB84(dVar10,0) + 1;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)local_ee0);
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)local_8c8,
             local_d80);
  auVar6 = local_8c8;
  Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false> *)local_640,
             (Matrix<double,_6,_6,_1,_6,_6> *)local_ee0,0,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false> *)local_640,
             (ChMatrixNM<double,_3,_3> *)((long)auVar6 + 0x40));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_8c0);
  local_640 = (undefined1  [8])&local_2e0;
  vStack_638.m_value = 0;
  local_cf0._0_8_ = local_ee0;
  vStack_cd0.m_value = (long)local_eb0;
  dStack_cb0 = local_e80;
  vStack_cd8.m_value = (long)local_df0;
  local_cf0._8_8_ = local_df0;
  pMStack_cc0 = local_e20;
  sStack_ce0.m_other = (double)local_e20;
  dStack_cb8 = local_e50;
  peStack_cc8 = (element_type *)local_e50;
  local_d40._0_8_ = local_ed8;
  vStack_d20.m_value = (long)local_ea8;
  local_d00 = (PointerType)local_e78;
  vStack_d28.m_value = (long)local_de8;
  local_d40._8_8_ = local_de8;
  vStack_d10.m_value = (long)local_e18;
  sStack_d30.m_other = local_e18;
  local_d08.m_value = (long)local_e48;
  pPStack_d18 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_e48;
  local_c70._0_8_ = local_ed0;
  dStack_c50 = local_ea0;
  local_c30 = local_e70;
  local_c58 = local_de0;
  local_c70._8_8_ = local_de0;
  vStack_c40.m_value = (long)local_e10;
  local_c60.m_other = local_e10;
  local_c38.m_value = (long)local_e40;
  pMStack_c48 = local_e40;
  sStack_630.m_other = 4.94065645841247e-324;
  vStack_628.m_value = 1;
  local_2e0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[0] =
       (double)local_ee0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_640,
                      &local_eb8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ec0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_eb8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_ed8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ec8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ec0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ec8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ed0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dc8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dc8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_de8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_de0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e20);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e00);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e18);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e08);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e00);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e08);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e10);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dc8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dc8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_de8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_dd8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_de0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_eb0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e88);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e90);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e88);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ea8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e98);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e90);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e98);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_ea0);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e50);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e28);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e30);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e28);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e48);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e38);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e30);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e38);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e40);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e20);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e00);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_df8);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e18);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e08);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e00);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e08);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e10);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e50);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e28);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e30);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e28);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e48);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e38);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e30);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e38);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,(Scalar *)&local_e40);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e80);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e58);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e60);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e58);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e78);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e68);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e60);
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                     (pCVar7,&local_e68);
  Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_(pCVar7,&local_e70);
  Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_640);
  uVar11 = 0;
  while( true ) {
    dVar10 = (double)(ulong)uVar11;
    if ((ulong)(*(long *)(DAT_011df5d0 + 0x38) - *(long *)(DAT_011df5d0 + 0x30) >> 3) <=
        (ulong)dVar10) break;
    dVar13 = *(double *)(*(long *)(static_tables_3333 + 0x30) + (long)dVar10 * 8);
    dVar13 = dVar13 + dVar13;
    local_db0 = dVar10;
    Calc_Sxi_D(local_db8,(MatrixNx3c *)local_b60,
               *(double *)(*(long *)(DAT_011df5d0 + 0x30) + (long)dVar10 * 8),0.0,0.0);
    local_640 = (undefined1  [8])local_d90;
    local_8c8 = (undefined1  [8])local_918;
    vStack_638.m_value = (long)local_b60;
    Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_8c8,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_3,_0,_9,_3>,_0>_>
                *)local_640);
    local_640 = (undefined1  [8])local_b60;
    vStack_638.m_value = (long)local_918;
    Eigen::PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)local_3b8,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
                *)local_640);
    auVar19._0_8_ =
         Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                   ((Matrix<double,_3,_3,_1,_3,_3> *)local_918);
    auVar19._8_56_ = extraout_var_00;
    auVar17._8_8_ = 0x8000000000000000;
    auVar17._0_8_ = 0x8000000000000000;
    auVar17 = vxorpd_avx512vl(auVar19._0_16_,auVar17);
    pMStack_8b8 = (XprTypeNested)local_cf0;
    local_bf0[0] = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)
                   (auVar17._0_8_ * (dVar13 + dVar13));
    vStack_8a0.m_value = (long)local_d40;
    local_880.m_value = (long)local_c70;
    local_a00._0_8_ = (double)local_bf0[0] * 0.5;
    _Stack_8c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8;
    vStack_8b0.m_value = (long)local_3b8;
    sStack_8a8.m_other = (double)local_3b8;
    peStack_898 = (element_type *)local_3b8;
    local_888.m_value = (long)local_3b8;
    local_878 = (element_type *)local_3b8;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>_>_>
                      *)local_640,(double *)local_a00,(StorageBaseType *)local_8c8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              (local_d88,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>_>_>_>
                *)local_640);
    for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
      local_da8 = (double)(lVar15 * 3);
      dVar10 = 0.0;
      while (dVar10 != 1.48219693752374e-323) {
        Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>::Block
                  ((Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false> *)local_a00,&local_2e0,
                   (Index)local_da8,(long)dVar10 * 3);
        vStack_8a0.m_value = (long)pdStack_9e0;
        peStack_898 = peStack_9d8;
        _Stack_8c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a00._0_8_;
        pMStack_8b8 = (XprTypeNested)local_a00._8_8_;
        vStack_8b0.m_value = (long)peStack_9f0;
        sStack_8a8.m_other = (double)pPStack_9e8;
        local_8c8 = (undefined1  [8])local_3b8;
        local_890.m_matrix = (non_const_type)local_3b8;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,9,9,1,9,9>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,3,3,false>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,0>>
                  ((Matrix<double,_9,_9,_1,_9,_9> *)local_640,
                   (Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>
                    *)local_8c8);
        Eigen::DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator*=
                  ((DenseBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_640,(Scalar *)local_bf0
                  );
        Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>::Block
                  ((Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false> *)local_a48,
                   (Matrix<double,_9,_3,_0,_9,_3> *)local_3b8,0,lVar15);
        local_da0 = dVar10;
        Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>::Block
                  ((Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false> *)local_c20,
                   (Matrix<double,_9,_3,_0,_9,_3> *)local_3b8,0,(Index)dVar10);
        pPStack_9b0 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)vStack_c00.m_value;
        pdStack_9a8 = pdStack_bf8;
        local_9d0 = (PointerType)local_c20._0_8_;
        peStack_9c8 = (element_type *)local_c20._8_8_;
        pPStack_9c0 = pPStack_c10;
        dStack_9b8 = (double)vStack_c08.m_value;
        local_a00._0_8_ = local_a48._0_8_;
        local_a00._8_8_ = local_a48._8_8_;
        peStack_9f0 = (element_type *)sStack_a38.m_other;
        pPStack_9e8 = (PlainObjectBase<Eigen::Matrix<double,9,3,0,9,3>> *)vStack_a30.m_value;
        pdStack_9e0 = (PointerType)vStack_a28.m_value;
        peStack_9d8 = peStack_a20;
        Eigen::PlainObjectBase<Eigen::Matrix<double,9,9,1,9,9>>::
        _set_noalias<Eigen::Product<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,9,3,0,9,3>,9,1,false>>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,9,9,1,9,9>> *)local_8c8,
                   (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_9,_1,_false>_>,_0>_>
                    *)local_a00);
        for (lVar9 = 0; lVar9 != 9; lVar9 = lVar9 + 1) {
          lVar14 = 0;
          for (lVar16 = 0; lVar16 != 9; lVar16 = lVar16 + 1) {
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_1> *)
                                local_640,lVar16,lVar9);
            Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>
                              *)local_a48,pSVar8,(StorageBaseType *)local_8c8);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_9,_9,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_9,_9,_false> *)local_a00,
                       local_d98,lVar14,lVar9 * 9);
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,9,9,false>>::
            operator+=((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,9,9,false>> *)
                       local_a00,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>
                        *)local_a48);
            lVar14 = lVar14 + 9;
          }
        }
        dVar10 = (double)((long)local_da0 + 1);
      }
    }
    uVar11 = SUB84(local_db0,0) + 1;
  }
  for (lVar15 = 0; lVar15 != 9; lVar15 = lVar15 + 1) {
    for (lVar9 = 0; lVar9 != 0x51; lVar9 = lVar9 + 9) {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_9,_9,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_9,_9,_false> *)local_8c8,local_d98
                 ,lVar9,lVar15 * 9);
      vStack_620.m_value = (long)sStack_8a8.m_other;
      vStack_618.m_value = vStack_8a0.m_value;
      local_640 = local_8c8;
      vStack_638.m_value = (long)_Stack_8c0._M_pi;
      sStack_630.m_other = (double)pMStack_8b8;
      vStack_628.m_value = vStack_8b0.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_9,_9,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_9,_9,_false> *)local_b60,local_d78
                 ,lVar9,lVar15 * 9);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,9,9,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,9,9,false>>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_9,_9,_false> *)local_b60,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_9,_9,_false>_> *)
                 local_640);
    }
  }
  return;
}

Assistant:

void ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsPreInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi = NP - 1;        // Gauss-Quadrature table index for xi
    unsigned int GQ_idx_eta_zeta = NT - 1;  // Gauss-Quadrature table index for eta and zeta

    m_O1.resize(NSF * NSF, NSF * NSF);
    m_O2.resize(NSF * NSF, NSF * NSF);
    m_K3Compact.resize(NSF, NSF);
    m_K13Compact.resize(NSF, NSF);

    m_K13Compact.setZero();
    m_K3Compact.setZero();
    m_O1.setZero();

    // =============================================================================
    // =============================================================================
    // Calculate the contribution to constant matrices needed to account for the integration across the volume of the
    // beam element, excluding the Poisson effect for the Enhanced Continuum Mechanics method
    // =============================================================================
    // =============================================================================

    // Get the components of the stiffness tensor in 6x6 matrix form that exclude the Poisson effect
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();
    ChMatrixNM<double, 6, 6> D;
    D.setZero();
    D.diagonal() = D0;

    // Setup the stiffness tensor in block matrix form to make it easier to iterate through all 4 subscripts
    ChMatrixNM<double, 9, 9> D_block;
    D_block << D(0, 0), D(0, 5), D(0, 4), D(0, 5), D(0, 1), D(0, 3), D(0, 4), D(0, 3), D(0, 2), D(5, 0), D(5, 5),
        D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3), D(5, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(5, 0), D(5, 5), D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3),
        D(5, 2), D(1, 0), D(1, 5), D(1, 4), D(1, 5), D(1, 1), D(1, 3), D(1, 4), D(1, 3), D(1, 2), D(3, 0), D(3, 5),
        D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3), D(3, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(3, 0), D(3, 5), D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3),
        D(3, 2), D(2, 0), D(2, 5), D(2, 4), D(2, 5), D(2, 1), D(2, 3), D(2, 4), D(2, 3), D(2, 2);

    // Pre-calculate the matrices of normalized shape function derivatives corrected for a potentially non-straight
    // reference configuration & GQ Weights times the determinate of the element Jacobian for later Calculating the
    // portion of the Selective Reduced Integration that does account for the Poisson effect
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * GQTable->Weight[GQ_idx_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
                double eta = GQTable->Lroots[GQ_idx_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_eta_zeta][it_zeta];

                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                MatrixNx3c Sxi_D_0xi = Sxi_D * J_0xi.inverse();
                double GQWeight_det_J_0xi = -J_0xi.determinant() * GQ_weight;

                // Shortcut for:
                // m_K3Compact += GQWeight_det_J_0xi * 0.5 * (Sxi_D_0xi*D11*Sxi_D_0xi.transpose() + Sxi_D_0xi *
                // D22*Sxi_D_0xi.transpose() + Sxi_D_0xi * D33*Sxi_D_0xi.transpose());
                m_K3Compact += GQWeight_det_J_0xi * 0.5 *
                               (D0(0) * Sxi_D_0xi.template block<NSF, 1>(0, 0) *
                                    Sxi_D_0xi.template block<NSF, 1>(0, 0).transpose() +
                                D0(1) * Sxi_D_0xi.template block<NSF, 1>(0, 1) *
                                    Sxi_D_0xi.template block<NSF, 1>(0, 1).transpose() +
                                D0(2) * Sxi_D_0xi.template block<NSF, 1>(0, 2) *
                                    Sxi_D_0xi.template block<NSF, 1>(0, 2).transpose());

                MatrixNxN scale;
                for (unsigned int n = 0; n < 3; n++) {
                    for (unsigned int c = 0; c < 3; c++) {
                        scale = Sxi_D_0xi * D_block.block<3, 3>(3 * n, 3 * c) * Sxi_D_0xi.transpose();
                        scale *= GQWeight_det_J_0xi;

                        MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose =
                            Sxi_D_0xi.template block<NSF, 1>(0, n) * Sxi_D_0xi.template block<NSF, 1>(0, c).transpose();
                        for (unsigned int f = 0; f < NSF; f++) {
                            for (unsigned int t = 0; t < NSF; t++) {
                                m_O1.block<NSF, NSF>(NSF * t, NSF * f) +=
                                    scale(t, f) * Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
                            }
                        }
                    }
                }
            }
        }
    }

    // =============================================================================
    // =============================================================================
    // Calculate the contribution to constant matrices needed to account for the integration across the volume of the
    // beam element, including the Poisson effect only along the beam axis (selective reduced integration) with 1 point
    // Gauss quadrature for the cross section directions
    // =============================================================================
    // =============================================================================

    // Get the components of the stiffness tensor in 6x6 matrix form that include the Poisson effect

    D.setZero();
    D.block(0, 0, 3, 3) = GetMaterial()->Get_Dv();

    // =============================================================================
    // Pull the required entries from the 4th order stiffness tensor that are needed for K3.  Note that D is written
    // in Voigt notation rather than a 4th other tensor so the correct entries from that matrix need to be pulled.
    // D11 = slice (matrix) of the 4th order tensor with last two subscripts = 1)
    // D22 = slice (matrix) of the 4th order tensor with last two subscripts = 2)
    // D33 = slice (matrix) of the 4th order tensor with last two subscripts = 3)
    // =============================================================================
    ChMatrixNM<double, 3, 3> D11;
    ChMatrixNM<double, 3, 3> D22;
    ChMatrixNM<double, 3, 3> D33;
    D11(0, 0) = D(0, 0);
    D11(1, 1) = D(1, 0);
    D11(2, 2) = D(2, 0);
    D11(1, 0) = D(5, 0);
    D11(0, 1) = D(5, 0);
    D11(2, 0) = D(4, 0);
    D11(0, 2) = D(4, 0);
    D11(2, 1) = D(3, 0);
    D11(1, 2) = D(3, 0);

    D22(0, 0) = D(0, 1);
    D22(1, 1) = D(1, 1);
    D22(2, 2) = D(2, 1);
    D22(1, 0) = D(5, 1);
    D22(0, 1) = D(5, 1);
    D22(2, 0) = D(4, 1);
    D22(0, 2) = D(4, 1);
    D22(2, 1) = D(3, 1);
    D22(1, 2) = D(3, 1);

    D33(0, 0) = D(0, 2);
    D33(1, 1) = D(1, 2);
    D33(2, 2) = D(2, 2);
    D33(1, 0) = D(5, 2);
    D33(0, 1) = D(5, 2);
    D33(2, 0) = D(4, 2);
    D33(0, 2) = D(4, 2);
    D33(2, 1) = D(3, 2);
    D33(1, 2) = D(3, 2);

    // Setup the stiffness tensor in block matrix form to make it easier to iterate through all 4 subscripts
    D_block << D(0, 0), D(0, 5), D(0, 4), D(0, 5), D(0, 1), D(0, 3), D(0, 4), D(0, 3), D(0, 2), D(5, 0), D(5, 5),
        D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3), D(5, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(5, 0), D(5, 5), D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3),
        D(5, 2), D(1, 0), D(1, 5), D(1, 4), D(1, 5), D(1, 1), D(1, 3), D(1, 4), D(1, 3), D(1, 2), D(3, 0), D(3, 5),
        D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3), D(3, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(3, 0), D(3, 5), D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3),
        D(3, 2), D(2, 0), D(2, 5), D(2, 4), D(2, 5), D(2, 1), D(2, 3), D(2, 4), D(2, 3), D(2, 2);

    // Loop over each Gauss quadrature point and sum the contribution to each constant matrix that will be used for
    // the internal force calculations
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * 2 * 2;
        double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
        double eta = 0;
        double zeta = 0;

        ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
        MatrixNx3c Sxi_D;          // Matrix of normalized shape function derivatives

        Calc_Sxi_D(Sxi_D, xi, eta, zeta);
        J_0xi.noalias() = m_ebar0 * Sxi_D;

        MatrixNx3c Sxi_D_0xi = Sxi_D * J_0xi.inverse();
        double GQWeight_det_J_0xi = -J_0xi.determinant() * GQ_weight;

        m_K3Compact += GQWeight_det_J_0xi * 0.5 *
                       (Sxi_D_0xi * D11 * Sxi_D_0xi.transpose() + Sxi_D_0xi * D22 * Sxi_D_0xi.transpose() +
                        Sxi_D_0xi * D33 * Sxi_D_0xi.transpose());

        MatrixNxN scale;
        for (unsigned int n = 0; n < 3; n++) {
            for (unsigned int c = 0; c < 3; c++) {
                scale = Sxi_D_0xi * D_block.block<3, 3>(3 * n, 3 * c) * Sxi_D_0xi.transpose();
                scale *= GQWeight_det_J_0xi;

                MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose =
                    Sxi_D_0xi.template block<NSF, 1>(0, n) * Sxi_D_0xi.template block<NSF, 1>(0, c).transpose();
                for (unsigned int f = 0; f < NSF; f++) {
                    for (unsigned int t = 0; t < NSF; t++) {
                        m_O1.block<NSF, NSF>(NSF * t, NSF * f) += scale(t, f) * Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
                    }
                }
            }
        }
    }

    // Since O2 is just a reordered version of O1, wait until O1 is completely calculated and then generate O2 from it
    for (unsigned int f = 0; f < NSF; f++) {
        for (unsigned int t = 0; t < NSF; t++) {
            m_O2.block<NSF, NSF>(NSF * t, NSF * f) = m_O1.block<NSF, NSF>(NSF * t, NSF * f).transpose();
        }
    }
}